

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O3

void __thiscall
wasm::BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier>::visitLoop
          (BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier> *this,Loop *curr)

{
  Function *pFVar1;
  Expression *local_20;
  
  emit(this,(Expression *)curr);
  visitPossibleBlockContents(this,curr->body);
  emitScopeEnd(this,(Expression *)curr);
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.id == 1) {
    pFVar1 = this[4].func;
    local_20 = (Expression *)
               MixedArena::allocSpace((MixedArena *)&this[2].func[1].super_Importable.base,0x10,8);
    local_20->_id = UnreachableId;
    (local_20->type).id = 1;
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&pFVar1[-1].effects,
               &local_20);
  }
  return;
}

Assistant:

void BinaryenIRWriter<SubType>::visitLoop(Loop* curr) {
  emit(curr);
  visitPossibleBlockContents(curr->body);
  emitScopeEnd(curr);
  if (curr->type == Type::unreachable) {
    // we emitted a loop without a return type, so it must not be consumed
    emitUnreachable();
  }
}